

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.h
# Opt level: O1

cmCommand * __thiscall cmCTestTestCommand::Clone(cmCTestTestCommand *this)

{
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0xa8);
  cmCTestTestCommand((cmCTestTestCommand *)this_00);
  this_00[1]._vptr_cmCommand =
       (_func_int **)(this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  this_00[1].Makefile =
       (cmMakefile *)(this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  return this_00;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestTestCommand* ni = new cmCTestTestCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }